

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::CleanupParseStack
          (Parse<SGParser::Generator::StdGrammarStackElement> *this,size_t tillPos)

{
  size_t markerIndex;
  ulong uVar1;
  long lVar2;
  
  uVar1 = this->StackPosition;
  if (tillPos < uVar1) {
    lVar2 = uVar1 * 0x38;
    do {
      markerIndex = *(size_t *)
                     ((long)&(this->pStack->
                             super_ParseStackElement<SGParser::Generator::StdGrammarToken>).
                             TerminalMarker + lVar2);
      if (markerIndex != 0xffffffffffffffff) {
        BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::ReleaseMarker
                  (&this->Stream,markerIndex);
      }
      Generator::StdGrammarStackElement::Cleanup
                ((StdGrammarStackElement *)
                 ((long)&(this->pStack->
                         super_ParseStackElement<SGParser::Generator::StdGrammarToken>).State +
                 lVar2));
      uVar1 = uVar1 - 1;
      lVar2 = lVar2 + -0x38;
    } while (tillPos < uVar1);
  }
  this->StackPosition = tillPos;
  return;
}

Assistant:

void Parse<StackElement>::CleanupParseStack(size_t tillPos) {
    // Call the destroy function for all stack elements (except 0 - special element)
    for (auto i = StackPosition; i > tillPos; --i) {
        if (pStack[i].TerminalMarker != InvalidIndex)
            Stream.ReleaseMarker(pStack[i].TerminalMarker);
        pStack[i].Cleanup();
    }
    // And reset position to last 'valid' element - usually 0
    StackPosition = tillPos;
}